

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O2

AArch64_AM_ShiftExtendType AArch64_AM_getShiftType(uint Imm)

{
  AArch64_AM_ShiftExtendType AVar1;
  AArch64_AM_ShiftExtendType AVar2;
  
  AVar2 = Imm >> 6 & AArch64_AM_UXTW;
  AVar1 = AArch64_AM_InvalidShiftExtend;
  if ((uint)AVar2 < 5) {
    AVar1 = AVar2;
  }
  return AVar1;
}

Assistant:

static inline AArch64_AM_ShiftExtendType AArch64_AM_getShiftType(unsigned Imm)
{
	switch ((Imm >> 6) & 0x7) {
		default: return AArch64_AM_InvalidShiftExtend;
		case 0: return AArch64_AM_LSL;
		case 1: return AArch64_AM_LSR;
		case 2: return AArch64_AM_ASR;
		case 3: return AArch64_AM_ROR;
		case 4: return AArch64_AM_MSL;
	}
}